

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md2.cpp
# Opt level: O2

bool __thiscall FMD2Model::Load(FMD2Model *this,char *path,int lumpnum,char *buffer,int length)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  FTextureID FVar9;
  FTextureID *pFVar10;
  ModelFrame *pMVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  
  (this->super_FDMDModel).header.magic = 0x32504449;
  (this->super_FDMDModel).header.version = 8;
  (this->super_FDMDModel).header.flags = 0;
  (this->super_FDMDModel).info.numLODs = 1;
  auVar2 = *(undefined1 (*) [16])(buffer + 8);
  iVar15 = *(int *)(buffer + 0x10);
  (this->super_FDMDModel).info.skinWidth = auVar2._0_4_;
  (this->super_FDMDModel).info.skinHeight = auVar2._4_4_;
  (this->super_FDMDModel).info.frameSize = auVar2._8_4_;
  (this->super_FDMDModel).info.numSkins = auVar2._12_4_;
  uVar8 = *(undefined8 *)(buffer + 0x18);
  (this->super_FDMDModel).info.numVertices = (int)uVar8;
  (this->super_FDMDModel).info.numTexCoords = (int)((ulong)uVar8 >> 0x20);
  iVar3 = *(int *)(buffer + 0x28);
  (this->super_FDMDModel).info.numFrames = iVar3;
  uVar8 = *(undefined8 *)(buffer + 0x2c);
  (this->super_FDMDModel).info.offsetSkins = (int)uVar8;
  (this->super_FDMDModel).info.offsetTexCoords = (int)((ulong)uVar8 >> 0x20);
  iVar4 = *(int *)(buffer + 0x38);
  (this->super_FDMDModel).info.offsetFrames = iVar4;
  iVar5 = *(int *)(buffer + 0x40);
  (this->super_FDMDModel).info.offsetLODs = iVar5;
  (this->super_FDMDModel).lodInfo[0].numTriangles = *(int *)(buffer + 0x20);
  iVar6 = *(int *)(buffer + 0x24);
  (this->super_FDMDModel).lodInfo[0].numGlCommands = iVar6;
  (this->super_FDMDModel).lodInfo[0].offsetTriangles = *(int *)(buffer + 0x34);
  (this->super_FDMDModel).lodInfo[0].offsetGlCommands = *(int *)(buffer + 0x3c);
  (this->super_FDMDModel).info.offsetEnd = iVar5;
  if (length < iVar15 * iVar3 + iVar4) {
    pcVar12 = "LoadModel: Model \'%s\' file too short\n";
  }
  else {
    if (0 < iVar6) {
      iVar15 = auVar2._12_4_;
      uVar13 = (long)iVar15 * 4;
      if (iVar15 < 0) {
        uVar13 = 0xffffffffffffffff;
      }
      pFVar10 = (FTextureID *)operator_new__(uVar13);
      (this->super_FDMDModel).skins = pFVar10;
      pcVar12 = buffer;
      for (lVar14 = 0; lVar14 < iVar15; lVar14 = lVar14 + 1) {
        FVar9 = LoadSkin(path,pcVar12 + (this->super_FDMDModel).info.offsetSkins);
        (this->super_FDMDModel).skins[lVar14].texnum = FVar9.texnum;
        iVar15 = (this->super_FDMDModel).info.numSkins;
        pcVar12 = pcVar12 + 0x40;
      }
      uVar7 = (this->super_FDMDModel).info.numFrames;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)uVar7;
      iVar15 = (this->super_FDMDModel).info.offsetFrames;
      uVar13 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x14),8) == 0) {
        uVar13 = SUB168(auVar2 * ZEXT816(0x14),0);
      }
      pMVar11 = (ModelFrame *)operator_new__(uVar13);
      (this->super_FDMDModel).frames = pMVar11;
      pcVar12 = buffer + (long)iVar15 + 0x18;
      iVar15 = (this->super_FDMDModel).info.frameSize;
      lVar14 = 0;
      uVar13 = 0;
      if (0 < (int)uVar7) {
        uVar13 = (ulong)uVar7;
      }
      for (; uVar13 * 0x14 - lVar14 != 0; lVar14 = lVar14 + 0x14) {
        pcVar1 = pMVar11->name + lVar14;
        uVar8 = *(undefined8 *)(pcVar12 + 8);
        *(undefined8 *)pcVar1 = *(undefined8 *)pcVar12;
        *(undefined8 *)(pcVar1 + 8) = uVar8;
        *(uint *)(pcVar1 + 0x10) = 0xffffffff;
        pcVar12 = pcVar12 + iVar15;
      }
      (this->super_FDMDModel).mLumpNum = lumpnum;
      return true;
    }
    pcVar12 = "LoadModel: Model \'%s\' invalid NumGLCommands\n";
  }
  Printf(pcVar12,path);
  return false;
}

Assistant:

bool FMD2Model::Load(const char * path, int lumpnum, const char * buffer, int length)
{
	md2_header_t * md2header = (md2_header_t *)buffer;
	ModelFrame *frame;
	byte   *md2_frames;
	int     i;

	// Convert it to DMD.
	header.magic = MD2_MAGIC;
	header.version = 8;
	header.flags = 0;
	info.skinWidth = LittleLong(md2header->skinWidth);
	info.skinHeight = LittleLong(md2header->skinHeight);
	info.frameSize = LittleLong(md2header->frameSize);
	info.numLODs = 1;
	info.numSkins = LittleLong(md2header->numSkins);
	info.numTexCoords = LittleLong(md2header->numTexCoords);
	info.numVertices = LittleLong(md2header->numVertices);
	info.numFrames = LittleLong(md2header->numFrames);
	info.offsetSkins = LittleLong(md2header->offsetSkins);
	info.offsetTexCoords = LittleLong(md2header->offsetTexCoords);
	info.offsetFrames = LittleLong(md2header->offsetFrames);
	info.offsetLODs = LittleLong(md2header->offsetEnd);	// Doesn't exist.
	lodInfo[0].numTriangles = LittleLong(md2header->numTriangles);
	lodInfo[0].numGlCommands = LittleLong(md2header->numGlCommands);
	lodInfo[0].offsetTriangles = LittleLong(md2header->offsetTriangles);
	lodInfo[0].offsetGlCommands = LittleLong(md2header->offsetGlCommands);
	info.offsetEnd = LittleLong(md2header->offsetEnd);

	if (info.offsetFrames + info.frameSize * info.numFrames > length)
	{
		Printf("LoadModel: Model '%s' file too short\n", path);
		return false;
	}
	if (lodInfo[0].numGlCommands <= 0)
	{
		Printf("LoadModel: Model '%s' invalid NumGLCommands\n", path);
		return false;
	}

	skins = new FTextureID[info.numSkins];

	for (i = 0; i < info.numSkins; i++)
	{
		skins[i] = LoadSkin(path, buffer + info.offsetSkins + i * 64);
	}

	// The frames need to be unpacked.
	md2_frames = (byte*)buffer + info.offsetFrames;
	frames = new ModelFrame[info.numFrames];

	for (i = 0, frame = frames; i < info.numFrames; i++, frame++)
	{
		md2_packedFrame_t *pfr = (md2_packedFrame_t *)(md2_frames + info.frameSize * i);

		memcpy(frame->name, pfr->name, sizeof(pfr->name));
		frame->vindex = UINT_MAX;
	}
	mLumpNum = lumpnum;
	return true;
}